

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Course.hpp
# Opt level: O2

void __thiscall
Course::Course(Course *this,string *newCourseName,int numUnits,string *newCourseDescription,
              string *newCourseRequisites)

{
  CourseComponent::CourseComponent(&this->super_CourseComponent);
  (this->super_CourseComponent).super_Observer._vptr_Observer = (_func_int **)&PTR_update_0010ed30;
  (this->courseRequisites)._M_dataplus._M_p = (pointer)&(this->courseRequisites).field_2;
  (this->courseRequisites)._M_string_length = 0;
  (this->courseRequisites).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_CourseComponent).courseName);
  (this->super_CourseComponent).courseUnits = numUnits;
  std::__cxx11::string::_M_assign((string *)&(this->super_CourseComponent).courseDescription);
  std::__cxx11::string::_M_assign((string *)&this->courseRequisites);
  return;
}

Assistant:

Course(string newCourseName, int numUnits, string newCourseDescription, string newCourseRequisites) : CourseComponent() {
            courseName = newCourseName;
            courseUnits = numUnits;
            courseDescription = newCourseDescription;
            courseRequisites = newCourseRequisites;
        }